

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_properties(t_iemgui *iemgui,t_symbol **srl)

{
  size_t srclen;
  char *pcVar1;
  t_symbol *ptVar2;
  int local_40c;
  char local_408 [4];
  int i;
  char label [1000];
  t_symbol **srl_local;
  t_iemgui *iemgui_local;
  
  *srl = iemgui->x_snd;
  srl[1] = iemgui->x_rcv;
  srl[2] = iemgui->x_lab;
  iemgui_all_sym2dollararg(iemgui,srl);
  for (local_40c = 0; local_40c < 3; local_40c = local_40c + 1) {
    if (srl[local_40c] != (t_symbol *)0x0) {
      pcVar1 = srl[local_40c]->s_name;
      srclen = strlen(srl[local_40c]->s_name);
      pcVar1 = pdgui_strnescape(local_408,1000,pcVar1,srclen);
      ptVar2 = gensym(pcVar1);
      srl[local_40c] = ptVar2;
    }
  }
  return;
}

Assistant:

void iemgui_properties(t_iemgui *iemgui, t_symbol **srl)
{
    char label[MAXPDSTRING];
    int i;
    srl[0] = iemgui->x_snd;
    srl[1] = iemgui->x_rcv;
    srl[2] = iemgui->x_lab;

    iemgui_all_sym2dollararg(iemgui, srl);

    for(i=0; i<3; i++) {
        if(srl[i])
            srl[i] = gensym(pdgui_strnescape(label, sizeof(label), srl[i]->s_name, strlen(srl[i]->s_name)));
    }
}